

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddTweak
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,string *file,
          TweakMethod tweak)

{
  cmScriptGeneratorIndent cVar1;
  ulong uVar2;
  ostream *poVar3;
  long *plVar4;
  code *in_stack_00000008;
  long in_stack_00000010;
  code *local_228;
  string local_1f0 [8];
  string tws;
  ostringstream local_1b8 [8];
  ostringstream tw;
  TweakMethod tweak_local;
  string *file_local;
  string *config_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  this_local._4_4_ = indent.Level;
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  plVar4 = (long *)((long)&(this->super_cmInstallGenerator).super_cmScriptGenerator.
                           _vptr_cmScriptGenerator + in_stack_00000010);
  if (((ulong)in_stack_00000008 & 1) == 0) {
    local_228 = in_stack_00000008;
  }
  else {
    local_228 = *(code **)(in_stack_00000008 + *plVar4 + -1);
  }
  cVar1 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
  (*local_228)(plVar4,local_1b8,cVar1.Level,config,file);
  std::__cxx11::ostringstream::str();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar3 = std::operator<<(poVar3,"if(EXISTS \"");
    poVar3 = std::operator<<(poVar3,(string *)file);
    poVar3 = std::operator<<(poVar3,"\" AND\n");
    poVar3 = ::operator<<(poVar3,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar3 = std::operator<<(poVar3,"   NOT IS_SYMLINK \"");
    poVar3 = std::operator<<(poVar3,(string *)file);
    std::operator<<(poVar3,"\")\n");
    std::operator<<(os,local_1f0);
    poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
    std::operator<<(poVar3,"endif()\n");
  }
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  return;
}

Assistant:

void cmInstallTargetGenerator::AddTweak(std::ostream& os, Indent indent,
                                        const std::string& config,
                                        std::string const& file,
                                        TweakMethod tweak)
{
  std::ostringstream tw;
  (this->*tweak)(tw, indent.Next(), config, file);
  std::string tws = tw.str();
  if (!tws.empty()) {
    os << indent << "if(EXISTS \"" << file << "\" AND\n"
       << indent << "   NOT IS_SYMLINK \"" << file << "\")\n";
    os << tws;
    os << indent << "endif()\n";
  }
}